

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid>::PrintTopologicalInfo
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid> *this,ostream *out)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  TPZGeoNode *pTVar4;
  size_type __dnew;
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Geo Element - fId ",0x12);
  poVar3 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t Type ",7);
  local_38 = 0x10;
  local_58 = local_48;
  local_58 = (long *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_48[0] = local_38;
  *local_58 = 0x6974617264617551;
  local_58[1] = 0x64696d6172795063;
  local_50 = local_38;
  *(char *)((long)local_58 + local_38) = '\0';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_58,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pzgeom::TPZNodeRep<13,_pztopology::TPZPyramid>::Print
            (&(this->fGeo).super_TPZNodeRep<13,_pztopology::TPZPyramid>,out);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x90))(this);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      pTVar4 = TPZGeoEl::NodePtr(&this->super_TPZGeoEl,iVar1);
      poVar3 = (ostream *)std::ostream::operator<<(out,pTVar4->fId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      iVar1 = iVar1 + 1;
      iVar2 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x90))(this);
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

virtual void PrintTopologicalInfo(std::ostream &out) override
	{
		out << "Geo Element - fId " << fId << "\t Type " << fGeo.TypeName() << "\t";
		fGeo.Print(out);
		int i;
		out << std::endl << "\t";
		for (i = 0;i < NNodes();i++) out << NodePtr(i)->Id() << " ";
	}